

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

bool __thiscall ON_RevSurface::IsValid(ON_RevSurface *this,ON_TextLog *text_log)

{
  bool bVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double length;
  int dim;
  ON_TextLog *text_log_local;
  ON_RevSurface *this_local;
  
  if (this->m_curve == (ON_Curve *)0x0) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"ON_RevSurface.m_curve is nullptr.\n");
    }
    this_local._7_1_ = false;
  }
  else {
    uVar2 = (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])();
    if ((uVar2 & 1) == 0) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"ON_RevSurface.m_curve is not valid.\n");
      }
      this_local._7_1_ = false;
    }
    else {
      uVar2 = (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])();
      if (uVar2 == 3) {
        bVar1 = ON_Line::IsValid(&this->m_axis);
        if (bVar1) {
          bVar1 = ON_Interval::IsIncreasing(&this->m_angle);
          if (bVar1) {
            dVar3 = ON_Interval::Length(&this->m_angle);
            if (dVar3 <= 6.283185307412417) {
              dVar4 = ON_Interval::Length(&this->m_angle);
              if (2.3283064365386963e-10 < dVar4) {
                bVar1 = ON_Interval::IsIncreasing(&this->m_t);
                if (bVar1) {
                  this_local._7_1_ = true;
                }
                else {
                  if (text_log != (ON_TextLog *)0x0) {
                    dVar3 = ON_Interval::operator[](&this->m_t,0);
                    dVar4 = ON_Interval::operator[](&this->m_t,1);
                    ON_TextLog::Print(text_log,
                                      "ON_RevSurface.m_t = (%g,%g) (should be an increasing interval)\n"
                                      ,dVar3,dVar4);
                  }
                  this_local._7_1_ = false;
                }
              }
              else {
                if (text_log != (ON_TextLog *)0x0) {
                  ON_TextLog::Print(text_log,
                                    "ON_RevSurface.m_angle.Length() = %g (should be > ON_ZERO_TOLERANCE).\n"
                                    ,dVar3);
                }
                this_local._7_1_ = false;
              }
            }
            else {
              if (text_log != (ON_TextLog *)0x0) {
                ON_TextLog::Print(text_log,
                                  "ON_RevSurface.m_angle.Length() = %g (should be <= 2*pi radians).\n"
                                  ,dVar3);
              }
              this_local._7_1_ = false;
            }
          }
          else {
            if (text_log != (ON_TextLog *)0x0) {
              dVar3 = ON_Interval::operator[](&this->m_angle,0);
              dVar4 = ON_Interval::operator[](&this->m_angle,1);
              ON_TextLog::Print(text_log,
                                "ON_RevSurface.m_angle = (%g,%g) (should be an increasing interval)\n"
                                ,dVar3,dVar4);
            }
            this_local._7_1_ = false;
          }
        }
        else {
          if (text_log != (ON_TextLog *)0x0) {
            ON_TextLog::Print(text_log,"ON_RevSurface.m_axis is not valid.\n");
          }
          this_local._7_1_ = false;
        }
      }
      else {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"ON_RevSurface.m_curve->Dimension()=%d (should be 3).\n",
                            (ulong)uVar2);
        }
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_RevSurface::IsValid( ON_TextLog* text_log ) const
{
  if ( !m_curve )
  {
    if ( text_log )
      text_log->Print( "ON_RevSurface.m_curve is nullptr.\n");
    return false;
  }
  if ( !m_curve->IsValid(text_log) )
  {
    if ( text_log )
      text_log->Print( "ON_RevSurface.m_curve is not valid.\n");
    return false;
  }
  int dim = m_curve->Dimension();
  if ( dim != 3 )
  {
    if ( text_log )
      text_log->Print( "ON_RevSurface.m_curve->Dimension()=%d (should be 3).\n",dim);
    return false;
  }
  if ( !m_axis.IsValid() )
  {
    if ( text_log )
      text_log->Print( "ON_RevSurface.m_axis is not valid.\n");
    return false;
  }
  if ( !m_angle.IsIncreasing() )
  {
    if ( text_log )
      text_log->Print( "ON_RevSurface.m_angle = (%g,%g) (should be an increasing interval)\n",
                       m_angle[0],m_angle[1]);
    return false;
  }
  double length = m_angle.Length();
  if ( length > 2.0*ON_PI + ON_ZERO_TOLERANCE )
  {
    if ( text_log )
      text_log->Print( "ON_RevSurface.m_angle.Length() = %g (should be <= 2*pi radians).\n",length);
    return false;
  }
  if ( m_angle.Length() <= ON_ZERO_TOLERANCE )
  {
    if ( text_log )
      text_log->Print( "ON_RevSurface.m_angle.Length() = %g (should be > ON_ZERO_TOLERANCE).\n",length);
    return false;
  }
  if ( !m_t.IsIncreasing() )
  {
    if ( text_log )
      text_log->Print( "ON_RevSurface.m_t = (%g,%g) (should be an increasing interval)\n",
                       m_t[0],m_t[1]);
    return false;
  }
  return true;
}